

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_chk_16_pcix(void)

{
  uint uVar1;
  short sVar2;
  uint uVar3;
  sint bound;
  sint src;
  
  uVar1 = m68ki_cpu.dar[m68ki_cpu.ir >> 9 & 7];
  sVar2 = (short)uVar1;
  uVar3 = OPER_PCIX_16();
  m68ki_cpu.not_z_flag = uVar1 & 0xffff;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  if ((sVar2 < 0) || ((short)uVar3 < sVar2)) {
    m68ki_cpu.n_flag = (uint)(sVar2 < 0) << 7;
    m68ki_exception_trap(6);
  }
  return;
}

Assistant:

static void m68k_op_chk_16_pcix(void)
{
	sint src = MAKE_INT_16(DX);
	sint bound = MAKE_INT_16(OPER_PCIX_16());

	FLAG_Z = ZFLAG_16(src); /* Undocumented */
	FLAG_V = VFLAG_CLEAR;   /* Undocumented */
	FLAG_C = CFLAG_CLEAR;   /* Undocumented */

	if(src >= 0 && src <= bound)
	{
		return;
	}
	FLAG_N = (src < 0)<<7;
	m68ki_exception_trap(EXCEPTION_CHK);
}